

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O0

size_t __thiscall websocketpp::http::parser::request::consume(request *this,char *buf,size_t len)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  difference_type dVar4;
  undefined8 uVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  ulong in_RSI;
  parser *in_RDI;
  request *in_stack_00000010;
  iterator in_stack_00000018;
  iterator in_stack_00000020;
  iterator end;
  iterator begin;
  size_t bytes_processed;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdc8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdd0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffde8;
  allocator *paVar9;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe00;
  value vVar10;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  byte bVar11;
  exception *in_stack_fffffffffffffe10;
  string local_188 [32];
  string local_168 [39];
  allocator local_141;
  string local_140 [37];
  byte local_11b;
  byte local_11a;
  allocator local_119;
  string local_118 [24];
  size_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  parser *in_stack_ffffffffffffff10;
  parser *in_stack_ffffffffffffff38;
  parser *in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [32];
  undefined8 local_50;
  char *local_48;
  char *local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char *local_30;
  size_t local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  ulong local_18;
  size_t local_8;
  
  if ((in_RDI[1].m_header_bytes & 1) == 0) {
    if (in_RDI->m_body_bytes_needed == 0) {
      local_20 = in_RDX;
      local_18 = in_RSI;
      peVar3 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x317216);
      std::__cxx11::string::append((char *)peVar3,local_18);
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x31723f);
      local_30 = (char *)std::__cxx11::string::begin();
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::__normal_iterator(&local_38);
      while( true ) {
        local_48 = local_30;
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x31727d);
        local_50 = std::__cxx11::string::end();
        __first1._M_current._7_1_ = in_stack_fffffffffffffe0f;
        __first1._M_current._0_7_ = in_stack_fffffffffffffe08;
        local_40 = (char *)std::
                           search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*>
                                     (__first1,in_stack_fffffffffffffe00,
                                      in_stack_fffffffffffffdf8._M_current,
                                      (char *)CONCAT17(in_stack_fffffffffffffdf7,
                                                       in_stack_fffffffffffffdf0));
        local_38 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_40;
        dVar4 = __gnu_cxx::operator-(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        in_RDI->m_header_bytes = dVar4 + 3 + in_RDI->m_header_bytes;
        if (16000 < in_RDI->m_header_bytes) {
          uVar5 = __cxa_allocate_exception(0x70);
          vVar10 = (value)((ulong)in_stack_fffffffffffffe00._M_current >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_70,"Maximum header size exceeded.",&local_71);
          std::__cxx11::string::string((string *)&stack0xffffffffffffff58);
          std::__cxx11::string::string((string *)&stack0xffffffffffffff38);
          exception::exception
                    (in_stack_fffffffffffffe10,
                     (string *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),vVar10,
                     (string *)in_stack_fffffffffffffdf8._M_current,
                     (string *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
          __cxa_throw(uVar5,&exception::typeinfo,exception::~exception);
        }
        std::
        __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x31743d);
        std::__cxx11::string::end();
        bVar1 = __gnu_cxx::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        if (bVar1) {
          std::
          __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x31749c);
          std::__cxx11::string::begin();
          __last._M_current._7_1_ = in_stack_fffffffffffffdf7;
          __last._M_current._0_7_ = in_stack_fffffffffffffdf0;
          std::
          copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (in_stack_fffffffffffffdf8,__last,in_stack_fffffffffffffde8);
          peVar3 = std::
                   __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3174e2);
          __gnu_cxx::operator-(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          std::__cxx11::string::resize((ulong)peVar3);
          std::
          __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x31751a);
          lVar6 = std::__cxx11::string::size();
          in_RDI->m_header_bytes = in_RDI->m_header_bytes - lVar6;
          return (size_t)local_20;
        }
        dVar4 = __gnu_cxx::operator-(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        if (dVar4 == 0) break;
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          parser::process_header
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          process(in_stack_00000010,in_stack_00000020,in_stack_00000018);
        }
        local_30 = (char *)__gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator+(in_stack_fffffffffffffdd8,
                                       (difference_type)in_stack_fffffffffffffdd0);
      }
      bVar2 = std::__cxx11::string::empty();
      vVar10 = (value)((ulong)in_stack_fffffffffffffe00._M_current >> 0x20);
      local_11a = 0;
      local_11b = 0;
      bVar11 = 1;
      if ((bVar2 & 1) == 0) {
        paVar9 = &local_119;
        std::allocator<char>::allocator();
        local_11a = 1;
        std::__cxx11::string::string(local_118,"Host",paVar9);
        vVar10 = (value)((ulong)paVar9 >> 0x20);
        local_11b = 1;
        in_stack_fffffffffffffdf8._M_current =
             (char *)parser::get_header(in_stack_fffffffffffffde8._M_current,
                                        in_stack_fffffffffffffde0);
        bVar11 = std::__cxx11::string::empty();
      }
      bVar2 = bVar11;
      if ((local_11b & 1) != 0) {
        std::__cxx11::string::~string(local_118);
      }
      if ((local_11a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      if ((bVar11 & 1) != 0) {
        uVar5 = __cxa_allocate_exception(0x70);
        paVar9 = &local_141;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,"Incomplete Request",paVar9);
        std::__cxx11::string::string(local_168);
        std::__cxx11::string::string(local_188);
        exception::exception
                  (in_stack_fffffffffffffe10,(string *)CONCAT17(bVar2,in_stack_fffffffffffffe08),
                   vVar10,(string *)in_stack_fffffffffffffdf8._M_current,
                   (string *)CONCAT17(bVar11,in_stack_fffffffffffffdf0));
        __cxa_throw(uVar5,&exception::typeinfo,exception::~exception);
      }
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3177eb);
      std::__cxx11::string::end();
      dVar4 = __gnu_cxx::operator-(in_stack_fffffffffffffdd0,local_20);
      local_28 = (long)local_20 + (2 - dVar4);
      std::
      __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ::reset((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               *)in_stack_fffffffffffffde0);
      bVar1 = parser::prepare_body(in_stack_ffffffffffffff38);
      if (bVar1) {
        sVar7 = parser::process_body
                          (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                           in_stack_ffffffffffffff00);
        local_28 = local_28 + sVar7;
        bVar1 = parser::body_ready(in_RDI);
        if (bVar1) {
          *(undefined1 *)&in_RDI[1].m_header_bytes = 1;
        }
        local_8 = local_28;
      }
      else {
        *(undefined1 *)&in_RDI[1].m_header_bytes = 1;
        local_8 = local_28;
      }
    }
    else {
      local_28 = parser::process_body
                           (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff00);
      bVar1 = parser::body_ready(in_RDI);
      if (bVar1) {
        *(undefined1 *)&in_RDI[1].m_header_bytes = 1;
      }
      local_8 = local_28;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

inline size_t request::consume(char const * buf, size_t len) {
    size_t bytes_processed;
    
    if (m_ready) {return 0;}
    
    if (m_body_bytes_needed > 0) {
        bytes_processed = process_body(buf,len);
        if (body_ready()) {
            m_ready = true;
        }
        return bytes_processed;
    }

    // copy new header bytes into buffer
    m_buf->append(buf,len);

    // Search for delimiter in buf. If found read until then. If not read all
    std::string::iterator begin = m_buf->begin();
    std::string::iterator end;

    for (;;) {
        // search for line delimiter
        end = std::search(
            begin,
            m_buf->end(),
            header_delimiter,
            header_delimiter+sizeof(header_delimiter)-1
        );
        
        m_header_bytes += (end-begin+sizeof(header_delimiter));
        
        if (m_header_bytes > max_header_size) {
            // exceeded max header size
            throw exception("Maximum header size exceeded.",
                status_code::request_header_fields_too_large);
        }

        if (end == m_buf->end()) {
            // we are out of bytes. Discard the processed bytes and copy the
            // remaining unprecessed bytes to the beginning of the buffer
            std::copy(begin,end,m_buf->begin());
            m_buf->resize(static_cast<std::string::size_type>(end-begin));
            m_header_bytes -= m_buf->size();

            return len;
        }

        //the range [begin,end) now represents a line to be processed.
        if (end-begin == 0) {
            // we got a blank line
            if (m_method.empty() || get_header("Host").empty()) {
                throw exception("Incomplete Request",status_code::bad_request);
            }

            bytes_processed = (
                len - static_cast<std::string::size_type>(m_buf->end()-end)
                    + sizeof(header_delimiter) - 1
            );

            // frees memory used temporarily during request parsing
            m_buf.reset();

            // if this was not an upgrade request and has a content length
            // continue capturing content-length bytes and expose them as a 
            // request body.
            
            if (prepare_body()) {
                bytes_processed += process_body(buf+bytes_processed,len-bytes_processed);
                if (body_ready()) {
                    m_ready = true;
                }
                return bytes_processed;
            } else {
                m_ready = true;

                // return number of bytes processed (starting bytes - bytes left)
                return bytes_processed;
            }
        } else {
            if (m_method.empty()) {
                this->process(begin,end);
            } else {
                this->process_header(begin,end);
            }
        }

        begin = end+(sizeof(header_delimiter)-1);
    }
}